

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_freeCDict(ZSTD_CDict *cdict)

{
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  ZSTD_customMem cMem;
  
  if (cdict != (ZSTD_CDict *)0x0) {
    customMem_00 = cdict->customMem;
    customMem = cdict->customMem;
    ZSTD_free(cdict->workspace,cdict->customMem);
    ZSTD_free(cdict->dictBuffer,customMem);
    ZSTD_free(cdict,customMem_00);
  }
  return 0;
}

Assistant:

size_t ZSTD_freeCDict(ZSTD_CDict* cdict)
{
    if (cdict==NULL) return 0;   /* support free on NULL */
    {   ZSTD_customMem const cMem = cdict->customMem;
        ZSTD_free(cdict->workspace, cMem);
        ZSTD_free(cdict->dictBuffer, cMem);
        ZSTD_free(cdict, cMem);
        return 0;
    }
}